

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vocab.c
# Opt level: O1

void vocerr_va_prep(voccxdef *ctx,vocerr_va_info *info,int err,char *f,__va_list_tag *argptr)

{
  char cVar1;
  uchar uVar2;
  runcxdef *ctx_00;
  runsdef *prVar3;
  objnum objn;
  char *pcVar4;
  size_t sVar5;
  int iVar6;
  int iVar7;
  undefined8 *puVar8;
  int *piVar9;
  undefined1 *puVar10;
  int *piVar11;
  uint uVar12;
  ulong __n;
  argbuf_t args [5];
  int local_88 [2];
  int local_80 [20];
  
  info->fmt = f;
  info->outp = info->user_msg;
  info->outsiz = 400;
  if ((ctx->voccxper == 0xffff) && (ctx->voccxperp == 0xffff)) {
    return;
  }
  ctx_00 = ctx->voccxrun;
  if (ctx->voccxperp != 0xffff) {
    piVar11 = local_88;
    pcVar4 = f;
    do {
      if (*pcVar4 == '%') {
        cVar1 = pcVar4[1];
        pcVar4 = pcVar4 + 1;
        if (cVar1 == 'c') {
          uVar12 = argptr->gp_offset;
          if ((ulong)uVar12 < 0x29) {
            puVar10 = (undefined1 *)((ulong)uVar12 + (long)argptr->reg_save_area);
            argptr->gp_offset = uVar12 + 8;
          }
          else {
            puVar10 = (undefined1 *)argptr->overflow_arg_area;
            argptr->overflow_arg_area = puVar10 + 8;
          }
          *(undefined1 *)(piVar11 + 2) = *puVar10;
          iVar7 = 2;
        }
        else if (cVar1 == 'd') {
          uVar12 = argptr->gp_offset;
          if ((ulong)uVar12 < 0x29) {
            piVar9 = (int *)((ulong)uVar12 + (long)argptr->reg_save_area);
            argptr->gp_offset = uVar12 + 8;
          }
          else {
            piVar9 = (int *)argptr->overflow_arg_area;
            argptr->overflow_arg_area = piVar9 + 2;
          }
          piVar11[2] = *piVar9;
          iVar7 = 1;
        }
        else {
          if (cVar1 != 's') goto LAB_001f4ebd;
          uVar12 = argptr->gp_offset;
          if ((ulong)uVar12 < 0x29) {
            puVar8 = (undefined8 *)((ulong)uVar12 + (long)argptr->reg_save_area);
            argptr->gp_offset = uVar12 + 8;
          }
          else {
            puVar8 = (undefined8 *)argptr->overflow_arg_area;
            argptr->overflow_arg_area = puVar8 + 1;
          }
          *(undefined8 *)(piVar11 + 2) = *puVar8;
          iVar7 = 0;
        }
        *piVar11 = iVar7;
        piVar11 = piVar11 + 4;
      }
      else if (*pcVar4 == '\0') goto LAB_001f4ec5;
LAB_001f4ebd:
      pcVar4 = pcVar4 + 1;
    } while( true );
  }
  iVar7 = 2;
  goto LAB_001f4f4f;
LAB_001f4ec5:
  if (piVar11 == local_88) {
    iVar7 = 2;
  }
  else {
    iVar7 = 2;
    piVar11 = piVar11 + -2;
    do {
      iVar6 = piVar11[-2];
      if (iVar6 == 2) {
        iVar6 = 1;
        piVar9 = piVar11;
LAB_001f4f1e:
        runpstr(ctx_00,(char *)piVar9,iVar6,0);
      }
      else if (iVar6 == 1) {
        runpnum(ctx_00,(long)*piVar11);
      }
      else if (iVar6 == 0) {
        piVar9 = *(int **)piVar11;
        sVar5 = strlen((char *)piVar9);
        iVar6 = (int)sVar5;
        goto LAB_001f4f1e;
      }
      iVar7 = iVar7 + 1;
      piVar9 = piVar11 + -2;
      piVar11 = piVar11 + -4;
    } while (piVar9 != local_88);
  }
LAB_001f4f4f:
  sVar5 = strlen(f);
  runpstr(ctx_00,f,(int)sVar5,0);
  runpnum(ctx_00,(long)err);
  objn = ctx->voccxperp;
  if (objn == 0xffff) {
    objn = ctx->voccxper;
  }
  runfn(ctx_00,objn,iVar7);
  prVar3 = ctx_00->runcxsp;
  uVar2 = prVar3[-1].runstyp;
  ctx_00->runcxsp = prVar3 + -1;
  if (uVar2 == '\x03') {
    if (prVar3[-1].runstyp != '\x03') {
      ctx_00->runcxerr->errcxptr->erraac = 0;
      runsign(ctx_00,0x3ef);
    }
    uVar12 = *(ushort *)prVar3[-1].runsv.runsvstr - 2;
    if (0x18e < uVar12) {
      uVar12 = 399;
    }
    __n = (ulong)uVar12;
    memcpy(info,(ushort *)((long)prVar3[-1].runsv.runsvstr + 2),__n);
    info->user_msg[__n] = '\0';
    info->fmt = info->user_msg;
    info->outp = info->user_msg + __n + 1;
    info->outsiz = 399 - __n;
  }
  return;
}

Assistant:

static void vocerr_va_prep(voccxdef *ctx, struct vocerr_va_info *info,
                           int err, char *f, va_list argptr)
{
    /* 
     *   presume that we'll use the given format string, instead of one
     *   provided by the program 
     */
    info->fmt = f;

    /* use the output buffer from the info structure */
    info->outp = info->user_msg;
    info->outsiz = sizeof(info->user_msg);

    /* 
     *   if the user has a parseError or parseErrorParam function, see if it
     *   provides a msg 
     */
    if (ctx->voccxper != MCMONINV || ctx->voccxperp != MCMONINV)
    {
        runcxdef *rcx = ctx->voccxrun;
        dattyp    typ;
        size_t    len;
        int       argc;

        /* start off with the two arguments that are always present */
        argc = 2;

        /* 
         *   if we're calling parseErrorParam, and we have additional
         *   arguments, push them as well 
         */
        if (ctx->voccxperp != MCMONINV)
        {
            enum typ_t
            {
                ARGBUF_STR, ARGBUF_INT, ARGBUF_CHAR
            };
            struct argbuf_t
            {
                enum typ_t typ;
                union
                {
                    char *strval;
                    int   intval;
                    char  charval;
                } val;
            };
            struct argbuf_t  args[5];
            struct argbuf_t *argp;
            char  *p;

            /* 
             *   Retrieve the arguments by examining the format string.  We
             *   must buffer up the arguments before pushing them, because
             *   we need to push them in reverse order (last to first); so,
             *   we must scan all arguments before we push the first one.  
             */
            for (p = f, argp = args ; *p != '\0' ; ++p)
            {
                /* check if this is a parameter */
                if (*p == '%')
                {
                    /* find out what type it is */
                    switch(*++p)
                    {
                    case 's':
                        /* string - save the char pointer */
                        argp->val.strval = va_arg(argptr, char *);
                        argp->typ = ARGBUF_STR;

                        /* consume an argument slot */
                        ++argp;
                        break;

                    case 'd':
                        /* integer - save the integer */
                        argp->val.intval = va_arg(argptr, int);
                        argp->typ = ARGBUF_INT;

                        /* consume an argument slot */
                        ++argp;
                        break;

                    case 'c':
                        /* character */
                        argp->val.charval = (char)va_arg(argptr, int);
                        argp->typ = ARGBUF_CHAR;

                        /* consume an argument slot */
                        ++argp;
                        break;

                    default:
                        /* 
                         *   ignore other types (there shouldn't be any
                         *   other types anyway) 
                         */
                        break;
                    }
                }
            }

            /*
             *   Push the arguments - keep looping until we get back to the
             *   first argument slot 
             */
            while (argp != args)
            {
                /* move to the next argument, working backwards */
                --argp;

                /* push this argument */
                switch(argp->typ)
                {
                case ARGBUF_STR:
                    /* push the string value */
                    runpstr(rcx, argp->val.strval,
                            (int)strlen(argp->val.strval), 0);
                    break;

                case ARGBUF_INT:
                    /* push the number value */
                    runpnum(rcx, argp->val.intval);
                    break;

                case ARGBUF_CHAR:
                    /* push the character as a one-character string */
                    runpstr(rcx, &argp->val.charval, 1, 0);
                    break;
                }

                /* count the argument */
                ++argc;
            }
        }

        /* push standard arguments: error code and default message */
        runpstr(rcx, f, (int)strlen(f), 0);         /* 2nd arg: default msg */
        runpnum(rcx, (long)err);                   /* 1st arg: error number */

        /* invoke parseErrorParam if it's defined, otherwise parseError */
        runfn(rcx, (objnum)(ctx->voccxperp == MCMONINV
                            ? ctx->voccxper : ctx->voccxperp), argc);

        /* see what the function returned */
        typ = runtostyp(rcx);
        if (typ == DAT_SSTRING)
        {
            char *p;
            
            /* 
             *   they returned a string - use it as the error message
             *   instead of the default message 
             */
            p = (char *)runpopstr(rcx);
            len = osrp2(p) - 2;
            p += 2;
            if (len > sizeof(info->user_msg) - 1)
                len = sizeof(info->user_msg) - 1;
            memcpy(info->user_msg, p, len);
            info->user_msg[len] = '\0';

            /* use the returned string as the message to display */
            info->fmt = info->user_msg;

            /* use the remainder of the buffer for the final formatting */
            info->outp = info->user_msg + len + 1;
            info->outsiz = sizeof(info->user_msg) - len - 1;
        }
        else
        {
            /* ignore other return values */
            rundisc(rcx);
        }
    }

}